

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O0

mecab_path_t * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::newPath(Allocator<mecab_node_t,_mecab_path_t> *this)

{
  FreeList<mecab_path_t> *pFVar1;
  FreeList<mecab_path_t> *p;
  mecab_path_t *pmVar2;
  FreeList<mecab_path_t> *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  
  pFVar1 = scoped_ptr<MeCab::FreeList<mecab_path_t>_>::get
                     ((scoped_ptr<MeCab::FreeList<mecab_path_t>_> *)&in_RDI->pi_);
  if (pFVar1 == (FreeList<mecab_path_t> *)0x0) {
    pFVar1 = (FreeList<mecab_path_t> *)&in_RDI->pi_;
    p = (FreeList<mecab_path_t> *)operator_new(0x38);
    FreeList<mecab_path_t>::FreeList(pFVar1,in_stack_ffffffffffffffc8);
    scoped_ptr<MeCab::FreeList<mecab_path_t>_>::reset
              ((scoped_ptr<MeCab::FreeList<mecab_path_t>_> *)in_RDI,p);
  }
  scoped_ptr<MeCab::FreeList<mecab_path_t>_>::operator->
            ((scoped_ptr<MeCab::FreeList<mecab_path_t>_> *)&in_RDI->pi_);
  pmVar2 = FreeList<mecab_path_t>::alloc(in_RDI);
  return pmVar2;
}

Assistant:

P *newPath() {
    if (!path_freelist_.get()) {
      path_freelist_.reset(new FreeList<P>(PATH_FREELIST_SIZE));
    }
    return path_freelist_->alloc();
  }